

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdSetReissueAsset(void *handle,void *create_handle,char *txid,uint32_t vout,
                      int64_t asset_amount,char *blinding_nonce,char *entropy,char *address,
                      char *direct_locking_script,char **asset_string)

{
  undefined8 uVar1;
  char *pcVar2;
  uint32_t in_ECX;
  IssuanceOutputParameter *in_RDX;
  long in_RSI;
  int64_t in_R8;
  char *in_R9;
  char *in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  undefined8 *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  IssuanceParameter data;
  IssuanceOutputParameter issuance_data;
  OutPoint outpoint;
  ConfidentialTransactionContext *tx;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  int result;
  IssuanceOutputParameter *in_stack_fffffffffffff830;
  string *in_stack_fffffffffffff840;
  undefined8 in_stack_fffffffffffff848;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff850;
  BlindFactor *blind_factor;
  bool *in_stack_fffffffffffff888;
  Amount *amount;
  OutPoint *in_stack_fffffffffffff890;
  ConfidentialTransactionContext *in_stack_fffffffffffff898;
  allocator *paVar3;
  BlindFactor *in_stack_fffffffffffff8b0;
  string local_6f0;
  allocator local_6c9;
  string *in_stack_fffffffffffff938;
  void *in_stack_fffffffffffff940;
  BlindFactor local_6a8;
  BlindFactor local_681;
  BlindFactor local_660 [2];
  ConfidentialAssetId local_620 [2];
  Amount local_5d0 [55];
  int64_t local_260;
  undefined1 local_258;
  Amount local_241 [2];
  Txid local_220 [2];
  char *in_stack_fffffffffffffe20;
  allocator local_1c9;
  string local_1c8 [38];
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [37];
  byte local_17b;
  undefined1 local_17a;
  allocator local_179;
  string local_178 [32];
  CfdSourceLocation local_158;
  undefined1 local_13a;
  allocator local_139;
  string local_138 [32];
  CfdSourceLocation local_118;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  long local_80;
  allocator local_71;
  string local_70 [52];
  undefined4 local_3c;
  char *local_38;
  int64_t local_30;
  uint32_t local_24;
  IssuanceOutputParameter *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff848 >> 0x20);
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"TransactionData",&local_71);
  cfd::capi::CheckBuffer(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  if ((in_stack_00000010 == 0) && (in_stack_00000018 == 0)) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0xb2c;
    local_98.funcname = "CfdSetReissueAsset";
    cfd::core::logger::warn<>(&local_98,"asset address and script is null.");
    local_ba = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"Failed to parameter. asset address and script is null.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff850,error_code,in_stack_fffffffffffff840);
    local_ba = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_20 == (IssuanceOutputParameter *)0x0) {
    local_d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_d8.filename = local_d8.filename + 1;
    local_d8.line = 0xb32;
    local_d8.funcname = "CfdSetReissueAsset";
    cfd::core::logger::warn<>(&local_d8,"txid is null.");
    local_fa = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Failed to parameter. txid is null.",&local_f9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff850,error_code,in_stack_fffffffffffff840);
    local_fa = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_38 == (char *)0x0) {
    local_118.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_118.filename = local_118.filename + 1;
    local_118.line = 0xb38;
    local_118.funcname = "CfdSetReissueAsset";
    cfd::core::logger::warn<>(&local_118,"blinding_nonce is null.");
    local_13a = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_138,"Failed to parameter. blinding_nonce is null.",&local_139);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff850,error_code,in_stack_fffffffffffff840);
    local_13a = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000008 == (char *)0x0) {
    local_158.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_158.filename = local_158.filename + 1;
    local_158.line = 0xb3e;
    local_158.funcname = "CfdSetReissueAsset";
    cfd::core::logger::warn<>(&local_158,"entropy is null.");
    local_17a = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"Failed to parameter. entropy is null.",&local_179);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff850,error_code,in_stack_fffffffffffff840);
    local_17a = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_17b = 0;
  cfd::capi::ConvertNetType
            ((int)((ulong)in_stack_fffffffffffff890 >> 0x20),in_stack_fffffffffffff888);
  if (*(long *)(local_80 + 0x18) == 0) {
    local_1a2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"Invalid handle state. tx is null",&local_1a1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff850,error_code,in_stack_fffffffffffff840);
    local_1a2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_17b & 1) != 0) {
    uVar1 = __cxa_allocate_exception(0x30);
    paVar3 = &local_1c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"Invalid handle state. tx is bitcoin.",paVar3);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff850,error_code,in_stack_fffffffffffff840);
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pcVar2 = *(char **)(local_80 + 0x18);
  amount = local_241;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)&local_241[0].amount_ + 1),(char *)local_20,(allocator *)amount);
  cfd::core::Txid::Txid(local_220,(string *)((long)&local_241[0].amount_ + 1));
  cfd::core::OutPoint::OutPoint((OutPoint *)(local_220 + 1),local_220,local_24);
  cfd::core::Txid::~Txid((Txid *)0x5c1400);
  std::__cxx11::string::~string((string *)((long)&local_241[0].amount_ + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_241);
  cfd::capi::ConvertToIssuanceParameter(pcVar2,in_stack_fffffffffffffe20);
  cfd::core::Amount::Amount(local_5d0,local_30);
  local_258 = local_5d0[0].ignore_check_;
  local_260 = local_5d0[0].amount_;
  blind_factor = &local_681;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)&local_681._vptr_BlindFactor + 1),local_38,(allocator *)blind_factor);
  cfd::core::BlindFactor::BlindFactor(local_660,(string *)((long)&local_681._vptr_BlindFactor + 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffff938,in_stack_00000008,&local_6c9);
  cfd::core::BlindFactor::BlindFactor(&local_6a8,(string *)&stack0xfffffffffffff938);
  cfd::ConfidentialTransactionContext::SetAssetReissuance
            (in_stack_fffffffffffff898,in_stack_fffffffffffff890,amount,local_20,blind_factor,
             in_stack_fffffffffffff8b0);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5c1572);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff938);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5c1599);
  std::__cxx11::string::~string((string *)((long)&local_681._vptr_BlindFactor + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  if (in_stack_00000020 != (undefined8 *)0x0) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_6f0,local_620);
    pcVar2 = cfd::capi::CreateString((string *)in_stack_fffffffffffff890);
    *in_stack_00000020 = pcVar2;
    std::__cxx11::string::~string((string *)&local_6f0);
  }
  local_4 = 0;
  cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)in_stack_fffffffffffff830);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(in_stack_fffffffffffff830);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x5c17d7);
  return local_4;
}

Assistant:

int CfdSetReissueAsset(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    int64_t asset_amount, const char* blinding_nonce, const char* entropy,
    const char* address, const char* direct_locking_script,
    char** asset_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if ((address == nullptr) && (direct_locking_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "asset address and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset address and script is null.");
    }
    if (txid == nullptr) {
      warn(CFD_LOG_SOURCE, "txid is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null.");
    }
    if (blinding_nonce == nullptr) {
      warn(CFD_LOG_SOURCE, "blinding_nonce is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding_nonce is null.");
    }
    if (entropy == nullptr) {
      warn(CFD_LOG_SOURCE, "entropy is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. entropy is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    OutPoint outpoint(Txid(txid), vout);
    cfd::IssuanceOutputParameter issuance_data =
        ConvertToIssuanceParameter(address, direct_locking_script);
    issuance_data.amount = Amount(asset_amount);

    auto data = tx->SetAssetReissuance(
        outpoint, issuance_data.amount, issuance_data,
        BlindFactor(blinding_nonce), BlindFactor(entropy));

    if (asset_string != nullptr) {
      *asset_string = CreateString(data.asset.GetHex());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}